

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# history.cpp
# Opt level: O0

bool __thiscall libchars::history::search_prev(history *this)

{
  bool bVar1;
  int iVar2;
  reference pbVar3;
  ulong uVar4;
  string *lis;
  _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_28;
  undefined8 local_20;
  const_iterator li_current;
  history *this_local;
  
  if (((byte)this[8] & 1) == 0) {
    this_local._7_1_ = false;
  }
  else {
    local_20 = *(undefined8 *)(this + 0x48);
    li_current._M_node = (_List_node_base *)this;
    do {
      lis = (string *)
            std::__cxx11::
            list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::begin((list<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                     *)(this + 0x30));
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::_List_const_iterator(&local_28,(iterator *)&lis);
      bVar1 = std::operator!=((_Self *)(this + 0x48),&local_28);
      if (!bVar1) {
        *(undefined8 *)(this + 0x48) = local_20;
        return true;
      }
      std::
      _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
      ::operator--((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                    *)(this + 0x48));
      pbVar3 = std::
               _List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               ::operator*((_List_const_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                            *)(this + 0x48));
    } while ((*(long *)(this + 0x58) != 0) &&
            ((uVar4 = std::__cxx11::string::length(), uVar4 < *(ulong *)(this + 0x58) ||
             (iVar2 = std::__cxx11::string::compare
                                ((ulong)(this + 0x10),0,*(string **)(this + 0x58),(ulong)pbVar3,0),
             iVar2 != 0))));
    this[0x50] = (history)0x0;
    this_local._7_1_ = true;
  }
  return this_local._7_1_;
}

Assistant:

bool history::search_prev()
    {
        if (!busy)
            return false;

        history_lines_t::const_iterator li_current(li);

        while (li != lines.begin()) {
            --li;
            const std::string &lis = *li;
            if (s_idx == 0 || (lis.length() >= s_idx && line_tmp.compare(0,s_idx,lis,0,s_idx) == 0)) {
                overflow = false;
                return true;
            }
        }

        // stay on previous value
        li = li_current;
        return true;
    }